

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_rtree_geometry_callback
              (sqlite3 *db,char *zGeom,
              _func_int_sqlite3_rtree_geometry_ptr_int_RtreeDValue_ptr_int_ptr *xGeom,void *pContext
              )

{
  undefined8 *p;
  RtreeGeomCallback *pGeomCtx;
  void *pContext_local;
  _func_int_sqlite3_rtree_geometry_ptr_int_RtreeDValue_ptr_int_ptr *xGeom_local;
  char *zGeom_local;
  sqlite3 *db_local;
  
  p = (undefined8 *)sqlite3_malloc(0x20);
  if (p == (undefined8 *)0x0) {
    db_local._4_4_ = 7;
  }
  else {
    *p = xGeom;
    p[1] = 0;
    p[2] = 0;
    p[3] = pContext;
    db_local._4_4_ =
         sqlite3_create_function_v2
                   (db,zGeom,-1,5,p,geomCallback,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,rtreeFreeCallback);
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_rtree_geometry_callback(
  sqlite3 *db,                  /* Register SQL function on this connection */
  const char *zGeom,            /* Name of the new SQL function */
  int (*xGeom)(sqlite3_rtree_geometry*,int,RtreeDValue*,int*), /* Callback */
  void *pContext                /* Extra data associated with the callback */
){
  RtreeGeomCallback *pGeomCtx;      /* Context object for new user-function */

  /* Allocate and populate the context object. */
  pGeomCtx = (RtreeGeomCallback *)sqlite3_malloc(sizeof(RtreeGeomCallback));
  if( !pGeomCtx ) return SQLITE_NOMEM;
  pGeomCtx->xGeom = xGeom;
  pGeomCtx->xQueryFunc = 0;
  pGeomCtx->xDestructor = 0;
  pGeomCtx->pContext = pContext;
  return sqlite3_create_function_v2(db, zGeom, -1, SQLITE_ANY, 
      (void *)pGeomCtx, geomCallback, 0, 0, rtreeFreeCallback
  );
}